

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cross_product.cpp
# Opt level: O3

unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true> __thiscall
duckdb::PhysicalCrossProduct::GetOperatorState(PhysicalCrossProduct *this,ExecutionContext *context)

{
  pointer pGVar1;
  _func_int **pp_Var2;
  
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                       *)(context + 3));
  pp_Var2 = (_func_int **)operator_new(0xf0);
  pp_Var2[1] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var2 + 2) = 0;
  *pp_Var2 = (_func_int *)&PTR__CrossProductOperatorState_02463c40;
  CrossProductExecutor::CrossProductExecutor
            ((CrossProductExecutor *)(pp_Var2 + 3),(ColumnDataCollection *)(pGVar1 + 1));
  (this->super_CachingPhysicalOperator).super_PhysicalOperator._vptr_PhysicalOperator = pp_Var2;
  return (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)
         (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)this;
}

Assistant:

unique_ptr<OperatorState> PhysicalCrossProduct::GetOperatorState(ExecutionContext &context) const {
	auto &sink = sink_state->Cast<CrossProductGlobalState>();
	return make_uniq<CrossProductOperatorState>(sink.rhs_materialized);
}